

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall Catch::TextFlow::Column::Column(Column *this,string *text)

{
  AnsiSkippingString::AnsiSkippingString(&this->m_string,text);
  this->m_width = 0x4f;
  this->m_indent = 0;
  this->m_initialIndent = 0xffffffffffffffff;
  return;
}

Assistant:

explicit Column( std::string const& text ): m_string( text ) {}